

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

optional<unsigned_long> __thiscall
tsbp::LeftmostActiveOnly::Branch(LeftmostActiveOnly *this,size_t nodeId)

{
  ulong *puVar1;
  int iVar2;
  pointer psVar3;
  pointer pRVar4;
  pointer pRVar5;
  __uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> _Var6;
  pointer psVar7;
  pointer psVar8;
  iterator iVar9;
  _Storage<unsigned_long,_true> _Var10;
  StoredVertexList *pSVar11;
  _Storage<unsigned_long,_true> _Var12;
  StoredVertexList *pSVar13;
  bool bVar14;
  size_type sVar15;
  Packing2D *pPVar16;
  void *pvVar17;
  ulong uVar18;
  pointer psVar19;
  int *piVar20;
  _Storage<unsigned_long,_true> _Var21;
  _Storage<unsigned_long,_true> unaff_R14;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  optional<unsigned_long> oVar22;
  vertex_descriptor leftNodeId_1;
  vertex_descriptor leftNodeId;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> attemptedItemIds;
  _Storage<unsigned_long,_true> local_88;
  _Storage<unsigned_long,_true> local_80;
  _Storage<unsigned_long,_true> local_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  _Head_base<0UL,_tsbp::Packing2D_*,_false> local_68;
  _Storage<unsigned_long,_true> local_60;
  void *local_58;
  _Head_base<0UL,_tsbp::Packing2D_*,_false> local_50;
  ulong local_48;
  StoredVertexList *local_40;
  Node *local_38;
  
  psVar3 = (this->tree).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(Status *)((long)&psVar3[nodeId].super_StoredVertex.m_property.super_BaseNode + 8) !=
      InfeasibleSequence) {
    pSVar13 = &(this->tree).super_type.m_vertices;
    psVar3 = psVar3 + nodeId;
    this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
              ((long)(psVar3->super_StoredVertex).m_property.Packing._M_t.
                     super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>.
                     _M_t + 0x18);
    unaff_R14._M_value =
         (long)*(pointer *)
                ((long)&(psVar3->super_StoredVertex).m_out_edges.
                        super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                + 8) -
         *(long *)&(psVar3->super_StoredVertex).m_out_edges.
                   super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
         >> 4;
    pRVar4 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pRVar5 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_80 = (_Storage<unsigned_long,_true>)nodeId;
    sVar15 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(this_00);
    if ((int *)unaff_R14._M_value != (int *)(((long)pRVar4 - (long)pRVar5 >> 5) - sVar15)) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_start >> 5,0,
                 (allocator<unsigned_long> *)&local_78);
      psVar7 = (pSVar13->
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar8 = *(pointer *)
                ((long)&psVar7[local_80._M_value].super_StoredVertex.m_out_edges.
                        super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                + 8);
      for (psVar19 = *(pointer *)
                      &psVar7[local_80._M_value].super_StoredVertex.m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
          ; psVar19 != psVar8; psVar19 = psVar19 + 1) {
        iVar2 = psVar7[(psVar19->super_stored_edge<unsigned_long>).m_target].super_StoredVertex.
                m_property.super_BaseNode.ItemIdToPlace;
        uVar18 = (ulong)iVar2;
        if (-1 < (long)uVar18) {
          if (local_48 <= uVar18) {
            __assert_fail("pos < m_num_bits","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                          0x40b,
                          "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::set(size_type, bool) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                         );
          }
          puVar1 = (ulong *)(local_60._M_value + (uVar18 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        }
      }
      unaff_R14 = (_Storage<unsigned_long,_true>)
                  (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_38 = &(psVar3->super_StoredVertex).m_property;
      pSVar11 = local_40;
      for (piVar20 = (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; local_40 = pSVar13,
          piVar20 != (int *)unaff_R14._M_value; piVar20 = piVar20 + 1) {
        iVar2 = *piVar20;
        uVar18 = (ulong)iVar2;
        bVar14 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                           (this_00,uVar18);
        if ((!bVar14) &&
           ((*(ulong *)(local_60._M_value + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f) & 1) == 0)) {
          local_88._M_value =
               ((long)(this->tree).super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->tree).super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
          local_78._M_value._4_4_ = 0;
          local_70 = 2;
          _Var6._M_t.
          super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
          super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl =
               (local_38->Packing)._M_t.
               super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t;
          local_78._M_value._0_4_ = iVar2;
          pPVar16 = (Packing2D *)operator_new(0xa0);
          Packing2D::Packing2D
                    (pPVar16,(Packing2D *)
                             _Var6._M_t.
                             super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                             .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl);
          pSVar13 = local_40;
          local_68._M_head_impl = pPVar16;
          AddLeafNode(this,(Node *)&local_78);
          std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::~unique_ptr
                    ((unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)&local_68
                    );
          _Var12 = local_80;
          _Var10 = local_88;
          _Var21 = local_88;
          if (local_88._M_value < local_80._M_value) {
            _Var21 = local_80;
          }
          if ((int *)(((long)(this->tree).super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->tree).super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)
              <= _Var21._M_value) {
            std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::resize(pSVar13,_Var21._M_value + 1);
          }
          psVar3 = (pSVar13->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_78._M_value._0_4_ = (undefined4)_Var10._M_value;
          local_78._M_value._4_4_ = (undefined4)((ulong)_Var10 >> 0x20);
          pvVar17 = operator_new(1);
          local_70 = SUB84(pvVar17,0);
          uStack_6c = (undefined4)((ulong)pvVar17 >> 0x20);
          std::
          vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
          ::emplace_back<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>
                    ((vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
                      *)(psVar3 + _Var12._M_value),
                     (stored_edge_property<unsigned_long,_boost::no_property> *)&local_78);
          if ((void *)CONCAT44(uStack_6c,local_70) != (void *)0x0) {
            operator_delete((void *)CONCAT44(uStack_6c,local_70),1);
          }
          iVar9._M_current =
               (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            this = (LeftmostActiveOnly *)&this->activeNodes;
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,iVar9,
                       &local_88._M_value);
          }
          else {
            *iVar9._M_current = (unsigned_long)local_88;
            (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
          uVar18 = CONCAT71((int7)((ulong)this >> 8),1);
          unaff_R14 = local_88;
          goto LAB_00147178;
        }
        pSVar13 = local_40;
        pSVar11 = local_40;
      }
      uVar18 = 0;
      local_40 = pSVar11;
LAB_00147178:
      bVar14 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
               m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &local_60);
      if (!bVar14) {
        __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                      0x2be,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      if ((void *)local_60._M_value != (void *)0x0) {
        operator_delete((void *)local_60,(long)local_50._M_head_impl - (long)local_60);
      }
      goto LAB_00146d95;
    }
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<unsigned_long&>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->nodesToDeactivate,&local_80);
    if (*(Status *)((long)&(psVar3->super_StoredVertex).m_property.super_BaseNode + 8) != Root) {
      _Var6._M_t.super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
      super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl =
           (psVar3->super_StoredVertex).m_property.Packing._M_t.
           super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t;
      if ((*(int *)((long)_Var6._M_t.
                          super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                          .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl + 4) != 0)
         || (*(int *)_Var6._M_t.
                     super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                     .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl !=
             *(int *)((long)_Var6._M_t.
                            super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                            .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl + 0x10)))
      {
        local_78._M_value =
             ((long)(this->tree).super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->tree).super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
        local_60._M_value = 0x1ffffffff;
        local_58 = (void *)CONCAT44(local_58._4_4_,2);
        _Var6._M_t.super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
        super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl =
             (psVar3->super_StoredVertex).m_property.Packing._M_t.
             super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t;
        pPVar16 = (Packing2D *)operator_new(0xa0);
        Packing2D::Packing2D
                  (pPVar16,(Packing2D *)
                           _Var6._M_t.
                           super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                           .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl);
        local_50._M_head_impl = pPVar16;
        AddLeafNode(this,(Node *)&local_60);
        std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::~unique_ptr
                  ((unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)&local_50);
        _Var12 = local_80;
        _Var10._M_value = local_78._M_value;
        _Var21 = local_78;
        if (local_78._M_value < local_80._M_value) {
          _Var21 = local_80;
        }
        if ((int *)(((long)(this->tree).super_type.m_vertices.
                           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->tree).super_type.m_vertices.
                           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <=
            _Var21._M_value) {
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::resize(pSVar13,_Var21._M_value + 1);
        }
        psVar3 = (pSVar13->
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_60._M_value = _Var10._M_value;
        local_58 = operator_new(1);
        std::
        vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
        ::emplace_back<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>
                  ((vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
                    *)(psVar3 + _Var12._M_value),
                   (stored_edge_property<unsigned_long,_boost::no_property> *)&local_60);
        if (local_58 != (void *)0x0) {
          operator_delete(local_58,1);
        }
        iVar9._M_current =
             (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          this = (LeftmostActiveOnly *)&this->activeNodes;
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,iVar9,
                     &local_78._M_value);
          unaff_R14 = local_78;
        }
        else {
          *iVar9._M_current = (unsigned_long)local_78;
          (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          unaff_R14 = local_78;
        }
        uVar18 = CONCAT71((int7)((ulong)this >> 8),1);
        goto LAB_00146d95;
      }
      *(Status *)((long)&(psVar3->super_StoredVertex).m_property.super_BaseNode + 8) =
           InfeasibleSequence;
    }
  }
  uVar18 = 0;
LAB_00146d95:
  oVar22.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar18 & 0xffffffff;
  oVar22.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R14._M_value;
  return (optional<unsigned_long>)
         oVar22.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> LeftmostActiveOnly::Branch(size_t nodeId)
{
    Node& currentNode = this->tree[nodeId];
    const boost::dynamic_bitset<>& placedItems = currentNode.PlacedItems();

    if (currentNode.NodeStatus == BaseNode::Status::InfeasibleSequence)
    {
        return std::nullopt;
    }

    // Determine number of outgoing edges.
    size_t numberOfOutgoingEdges = boost::out_degree(nodeId, this->tree);
    size_t numberOfRemainingItems = items.size() - placedItems.count();

    ////bool isFixedSequenceDeactivation = numberOfOutgoingEdges == 1 && IsFixedSequence(currentNode, -1);
    ////if (numberOfOutgoingEdges == numberOfRemainingItems || isFixedSequenceDeactivation)
    if (numberOfOutgoingEdges == numberOfRemainingItems)
    {
        // TODO.Logic: currently the DeactivatePlacement node is the last node that is generated. Rework to allow it to be explored in any sequence.

        this->nodesToDeactivate.emplace(nodeId);

        const Packing2D& packing = *currentNode.Packing;

        int placementX = packing.ActiveX;
        int placementY = packing.ActiveY;

        if (currentNode.NodeStatus == Node::Status::Root)
        {
            return std::nullopt;
        }

        if (placementY == 0 && placementX == packing.MaxX)
        {
            currentNode.NodeStatus = BaseNode::Status::InfeasibleSequence;
            return std::nullopt;
        }

        /*
        typename SearchTree::in_edge_iterator inEdgeIterator;
        typename SearchTree::in_edge_iterator inEdgeEndIterator;
        typename SearchTree::edge_descriptor inEdge;

        for (boost::tie(inEdgeIterator, inEdgeEndIterator) = boost::in_edges(this->tree, nodeId); inEdgeIterator != inEdgeEndIterator; ++inEdgeIterator)
        {
            inEdge = *inEdgeIterator;
            typename SearchTree::vertex_descriptor targetId = boost::source(inEdge, this->tree);
            const Node& targetNode = this->tree[targetId];
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{-1, BaseNode::Type::DeactivatePlacement, BaseNode::Status::NotEvaluated, std::make_unique<Packing2D>(*currentNode.Packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // TODO.Safety: Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().
        // TODO.Performance: Consider using std::unique_ptr<Node> to reduce copy effort.

        this->activeNodes.push_back(leftNodeId);

        return leftNodeId;
    }

    typename SearchTree::out_edge_iterator outEdgeIterator;
    typename SearchTree::out_edge_iterator outEdgeEndIterator;
    typename SearchTree::edge_descriptor outEdge;

    boost::dynamic_bitset<> attemptedItemIds(items.size());

    for (boost::tie(outEdgeIterator, outEdgeEndIterator) = boost::out_edges(nodeId, this->tree); outEdgeIterator != outEdgeEndIterator; ++outEdgeIterator)
    {
        outEdge = *outEdgeIterator;
        typename SearchTree::vertex_descriptor targetId = boost::target(outEdge, this->tree);
        const Node& targetNode = this->tree[targetId];

        if (targetNode.ItemIdToPlace >= 0)
        {
            attemptedItemIds.set(targetNode.ItemIdToPlace);
        }
    }

    std::optional<size_t> newNodeId;
    // TODO.Logic: different branching logic, e.g. largest item or deliberately disable placement.
    ////for (size_t i = 0; i < items.size(); i++)
    for (int i: this->branchingOrder)
    {
        ////if (placedItems.contains(i) || attemptedItemIds[i])
        if (placedItems[i] || attemptedItemIds[i])
        {
            continue;
        }

        /*
        if (!IsFixedSequence(currentNode, i))
        {
            continue;
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{(int)i, BaseNode::Type::UsePlacement, BaseNode::Status::NotEvaluated, std::make_unique<Packing2D>(*currentNode.Packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // TODO.Safety: Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().

        this->activeNodes.push_back(leftNodeId);
        newNodeId = leftNodeId;

        break;
    }

    return newNodeId;
}